

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  FileMetaData f;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_c8 = 0;
  local_c0[0] = 0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_d0 = local_c0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_assign((string *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&local_b0);
  local_90._8_4_ = 0;
  local_90._12_4_ = 0x40000000;
  local_90._0_4_ = level;
  local_90._24_8_ = file_size;
  local_70._M_p = local_60;
  local_90._16_8_ = file;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d0,local_d0 + local_c8);
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_b0,local_b0 + local_a8);
  std::
  vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
  ::emplace_back<std::pair<int,leveldb::FileMetaData>>
            ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
              *)&this->new_files_,(pair<int,_leveldb::FileMetaData> *)local_90);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }